

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O2

void __thiscall xmrig::OclConfig::generate(OclConfig *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var4;
  size_t sVar5;
  ulong __n;
  OclDevice *device;
  pointer __args;
  uint32_t local_8c;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> devices;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_68;
  OclPlatform local_50;
  OclPlatform local_40;
  
  if (this->m_enabled == true) {
    bVar1 = Threads<xmrig::OclThreads>::has(&this->m_threads);
    if (!bVar1) {
      iVar2 = OclLib::init((EVP_PKEY_CTX *)(this->m_loader).m_data);
      if ((char)iVar2 != '\0') {
        if ((this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_40 = platform(this);
          OclPlatform::devices(&devices,&local_40);
        }
        else {
          local_50 = platform(this);
          OclPlatform::devices(&local_68,&local_50);
          devices.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          devices.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          devices.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar3 = ((long)local_68.
                         super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x68;
          __n = (long)(this->m_devicesHint).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_devicesHint).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
          if (uVar3 <= __n) {
            __n = uVar3;
          }
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::reserve(&devices,__n);
          for (__args = local_68.
                        super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              __args != local_68.
                        super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                        _M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
            local_8c = __args->m_index;
            _Var4 = std::
                    __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                              ((this->m_devicesHint).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (this->m_devicesHint).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_8c);
            if (_Var4._M_current !=
                (this->m_devicesHint).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>>::
              emplace_back<xmrig::OclDevice_const&>
                        ((vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>> *)&devices,
                         __args);
            }
          }
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_68);
        }
        if (devices.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
            super__Vector_impl_data._M_start !=
            devices.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          sVar5 = xmrig::generate(&this->m_threads,&devices);
          this->m_shouldSave = sVar5 != 0;
        }
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&devices);
      }
    }
  }
  return;
}

Assistant:

void xmrig::OclConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!OclLib::init(loader())) {
        return;
    }

    const auto devices = m_devicesHint.empty() ? platform().devices() : filterDevices(platform().devices(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, devices);

    m_shouldSave = count > 0;
}